

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<short>::test_many<(libdivide::Branching)1>(DivideTest<short> *this,short denom)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  ushort in_SI;
  DivideTest<short> *in_RDI;
  short recovered;
  divider<short,_(libdivide::Branching)1> the_divider;
  libdivide_s16_t tmp;
  libdivide_s16_branchfree_t result;
  int16_t magic;
  uint16_t twice_rem;
  uint16_t e;
  uint16_t proposed_m;
  uint16_t rem;
  uint8_t more;
  uint16_t floor_log_2_d;
  uint16_t absD;
  uint16_t ud;
  libdivide_s16_t result_1;
  uint16_t result_2;
  uint32_t n;
  divider<short,_(libdivide::Branching)1> *in_stack_ffffffffffffff30;
  string *psVar4;
  short denom_00;
  divider<short,_(libdivide::Branching)1> *pdVar5;
  short denom_01;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined6 in_stack_ffffffffffffff58;
  short in_stack_ffffffffffffff5e;
  DivideTest<short> *in_stack_ffffffffffffff60;
  divider<short,_(libdivide::Branching)1> local_7d;
  ushort local_7a;
  divider<short,_(libdivide::Branching)1> *local_68;
  divider<short,_(libdivide::Branching)1> *local_58;
  short local_4c;
  byte local_4a;
  short local_45;
  byte local_43;
  short local_3f;
  byte local_3d;
  short local_3c;
  byte local_3a;
  short local_36;
  ushort local_34;
  short local_32;
  short in_stack_ffffffffffffffd0;
  ushort in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd4;
  byte in_stack_ffffffffffffffd5;
  short denom_02;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  short sVar6;
  byte bVar7;
  uint local_4;
  
  pdVar5 = &local_7d;
  local_68 = pdVar5;
  local_58 = pdVar5;
  if (in_SI == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
            "divider must be != 0");
    abort();
  }
  if ((short)in_SI < 0) {
    uVar3 = -(uint)in_SI;
  }
  else {
    uVar3 = (uint)in_SI;
  }
  uVar2 = (ushort)uVar3;
  sVar1 = 0xf - ((short)LZCOUNT(uVar3 & 0xffff) + -0x10);
  bVar7 = (byte)sVar1;
  if ((uVar3 & 0xffff & (uVar3 & 0xffff) - 1) == 0) {
    local_4c = 0;
    local_4a = 0;
    if ((short)in_SI < 0) {
      local_4a = 0x80;
    }
    local_4a = bVar7 | local_4a;
  }
  else {
    local_4 = (1 << (bVar7 - 1 & 0x1f)) << 0x10;
    local_36 = (short)(local_4 / (uVar3 & 0xffff));
    sVar6 = local_36 * uVar2;
    in_stack_ffffffffffffffd2 = -sVar6;
    local_32 = uVar2 + sVar6;
    local_36 = local_36 * 2;
    local_34 = sVar6 * -2;
    if ((uVar2 <= local_34) || (local_34 < in_stack_ffffffffffffffd2)) {
      local_36 = local_36 + 1;
    }
    in_stack_ffffffffffffffd5 = bVar7 | 0x40;
    local_36 = local_36 + 1;
    in_stack_ffffffffffffffd0 = local_36;
    local_4c = local_36;
    local_4a = in_stack_ffffffffffffffd5;
    if ((short)in_SI < 0) {
      in_stack_ffffffffffffffd5 = bVar7 | 0xc0;
      local_4a = in_stack_ffffffffffffffd5;
    }
  }
  denom_02 = 0;
  local_7a = in_SI;
  local_45 = local_4c;
  local_43 = local_4a;
  local_3f = local_4c;
  local_3d = local_4a;
  local_3c = local_4c;
  local_3a = local_4a;
  sVar6 = local_4c;
  bVar7 = local_4a;
  local_7d.div.denom.magic = local_4c;
  local_7d.div.denom.more = local_4a;
  uVar2 = libdivide::divider<short,_(libdivide::Branching)1>::recover(&local_7d);
  denom_01 = (short)((ulong)pdVar5 >> 0x30);
  denom_00 = (short)(uVar3 >> 0x10);
  if (uVar2 != local_7a) {
    std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
    psVar4 = (string *)&stack0xffffffffffffff60;
    testcase_name_abi_cxx11_
              ((DivideTest<short> *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff54);
    std::operator<<((ostream *)&std::cerr,psVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::operator<<((ostream *)&std::cerr,": ");
    std::ostream::operator<<((ostream *)&std::cerr,local_7a);
    std::operator<<((ostream *)&std::cerr,", but got ");
    std::ostream::operator<<((ostream *)&std::cerr,uVar2);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(1);
  }
  test_edgecase_numerators<(libdivide::Branching)1>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e,
             (divider<short,_(libdivide::Branching)1> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  test_small_numerators<(libdivide::Branching)1>(in_RDI,denom_00,in_stack_ffffffffffffff30);
  test_pow2_numerators<(libdivide::Branching)1>
            ((DivideTest<short> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             denom_01,(divider<short,_(libdivide::Branching)1> *)in_RDI);
  test_allbits_numerators<(libdivide::Branching)1>(in_RDI,denom_00,in_stack_ffffffffffffff30);
  test_random_numerators<(libdivide::Branching)1>
            ((DivideTest<short> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             denom_01,(divider<short,_(libdivide::Branching)1> *)in_RDI);
  test_vectordivide_numerators<(libdivide::Branching)1>
            ((DivideTest<short> *)
             CONCAT17(bVar7,CONCAT25(sVar6,CONCAT14(in_stack_ffffffffffffffe4,
                                                    CONCAT22(in_SI,in_stack_ffffffffffffffe0)))),
             denom_02,(divider<short,_(libdivide::Branching)1> *)
                      CONCAT26(sVar1,CONCAT15(in_stack_ffffffffffffffd5,
                                              CONCAT14(in_stack_ffffffffffffffd4,
                                                       CONCAT22(in_stack_ffffffffffffffd2,
                                                                in_stack_ffffffffffffffd0)))));
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }